

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::ConvertToRgb
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  uchar *puVar5;
  ulong uVar6;
  byte *pbVar7;
  uchar *puVar8;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(out);
  if (in->_colorCount == '\x03') {
    Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
    return;
  }
  uVar2 = out->_rowSize;
  uVar3 = in->_rowSize;
  puVar5 = out->_data + (ulong)(startXOut * 3) + (ulong)(startYOut * uVar2);
  pbVar4 = in->_data + (ulong)startXIn + (ulong)(startYIn * uVar3);
  puVar8 = puVar5 + height * uVar2;
  for (; puVar5 != puVar8; puVar5 = puVar5 + uVar2) {
    pbVar7 = pbVar4;
    for (uVar6 = 0; width * 3 != uVar6; uVar6 = uVar6 + 3) {
      bVar1 = *pbVar7;
      pbVar7 = pbVar7 + 1;
      *(uchar *)((long)(puVar5 + uVar6) + 2) = (uchar)((ushort)bVar1 * 0x101);
      *(ushort *)(puVar5 + uVar6) = (ushort)bVar1 * 0x101;
    }
    pbVar4 = pbVar4 + uVar3;
  }
  return;
}

Assistant:

void ConvertToRgb( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                       uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyRGBImage     ( out );

        if( in.colorCount() == RGB ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t colorCount = RGB;

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        width = width * colorCount;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; outX += colorCount, ++inX )
                memset( outX, (*inX), sizeof( uint8_t ) * colorCount );
        }
    }